

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Definition * __thiscall cppforth::Forth::getDefinition(Forth *this,Cell index)

{
  pointer pDVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  pDVar1 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x50) <=
      (ulong)index) {
    std::__cxx11::to_string(&local_38,index);
    std::operator+(&bStack_58,"Access to definitions out of range ",&local_38);
    throwCppExceptionMessage(this,&bStack_58,errorUndefinedWord);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    pDVar1 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return pDVar1 + index;
}

Assistant:

Definition *getDefinition(Cell index){
			if ((index < 0) || (index >= definitions.size())){
					throwCppExceptionMessage("Access to definitions out of range "+std::to_string(index),errorUndefinedWord);
			}
			return &definitions[index];
		}